

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.c
# Opt level: O2

stb_vorbis *
stb_vorbis_open_pushdata(uchar *data,int data_len,int *data_used,int *error,stb_vorbis_alloc *alloc)

{
  int iVar1;
  STBVorbisError SVar2;
  stb_vorbis *__dest;
  vorb vStack_798;
  
  memset(&vStack_798,0,0x770);
  if (alloc != (stb_vorbis_alloc *)0x0) {
    vStack_798.alloc.alloc_buffer = alloc->alloc_buffer;
    vStack_798.alloc.alloc_buffer_length_in_bytes =
         (int)*(ulong *)&alloc->alloc_buffer_length_in_bytes;
    vStack_798.temp_offset = vStack_798.alloc.alloc_buffer_length_in_bytes & 0xfffffff8;
    vStack_798.alloc._8_8_ = *(ulong *)&alloc->alloc_buffer_length_in_bytes & 0xfffffffffffffff8;
  }
  vStack_798.eof = 0;
  vStack_798.error = VORBIS__no_error;
  vStack_798.codebooks = (Codebook *)0x0;
  vStack_798.page_crc_tests = -1;
  vStack_798.close_on_free = 0;
  vStack_798.f = (FILE *)0x0;
  vStack_798.stream_end = data + data_len;
  vStack_798.push_mode = '\x01';
  vStack_798.stream = data;
  iVar1 = start_decoder(&vStack_798);
  if (iVar1 == 0) {
    if (vStack_798.eof == 0) {
      SVar2 = vStack_798.error;
    }
    else {
      SVar2 = VORBIS_need_more_data;
    }
    *error = SVar2;
  }
  else {
    __dest = vorbis_alloc(&vStack_798);
    if (__dest != (stb_vorbis *)0x0) {
      memcpy(__dest,&vStack_798,0x770);
      *data_used = *(int *)&__dest->stream - (int)data;
      *error = 0;
      return __dest;
    }
  }
  vorbis_deinit(&vStack_798);
  return (stb_vorbis *)0x0;
}

Assistant:

stb_vorbis *stb_vorbis_open_pushdata(
         const unsigned char *data, int data_len, // the memory available for decoding
         int *data_used,              // only defined if result is not NULL
         int *error, const stb_vorbis_alloc *alloc)
{
   stb_vorbis *f, p;
   vorbis_init(&p, alloc);
   p.stream     = (uint8 *) data;
   p.stream_end = (uint8 *) data + data_len;
   p.push_mode  = TRUE;
   if (!start_decoder(&p)) {
      if (p.eof)
         *error = VORBIS_need_more_data;
      else
         *error = p.error;
      vorbis_deinit(&p);
      return NULL;
   }
   f = vorbis_alloc(&p);
   if (f) {
      *f = p;
      *data_used = (int) (f->stream - data);
      *error = 0;
      return f;
   } else {
      vorbis_deinit(&p);
      return NULL;
   }
}